

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

Convolution3DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_convolution3d(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  Convolution3DLayerParams *pCVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_convolution3d(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_convolution3d(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pCVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::Convolution3DLayerParams>(arena);
    (this->layer_).convolution3d_ = pCVar2;
  }
  return (Convolution3DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::Convolution3DLayerParams* NeuralNetworkLayer::_internal_mutable_convolution3d() {
  if (!_internal_has_convolution3d()) {
    clear_layer();
    set_has_convolution3d();
    layer_.convolution3d_ = CreateMaybeMessage< ::CoreML::Specification::Convolution3DLayerParams >(GetArenaForAllocation());
  }
  return layer_.convolution3d_;
}